

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

void __thiscall MT32Emu::Synth::setReportHandler2(Synth *this,ReportHandler2 *reportHandler2)

{
  ReportHandler2 *pRVar1;
  
  pRVar1 = &this->extensions->defaultReportHandler;
  if (reportHandler2 != (ReportHandler2 *)0x0) {
    pRVar1 = reportHandler2;
  }
  this->extensions->reportHandler2 = pRVar1;
  this->reportHandler = &pRVar1->super_ReportHandler;
  return;
}

Assistant:

void Synth::setReportHandler2(ReportHandler2 *reportHandler2) {
	if (reportHandler2 != NULL) {
		reportHandler = reportHandler2;
		extensions.reportHandler2 = reportHandler2;
	} else {
		reportHandler = &extensions.defaultReportHandler;
		extensions.reportHandler2 = &extensions.defaultReportHandler;
	}
}